

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

int Au_XsimInv(int Value)

{
  int local_c;
  int Value_local;
  
  if (Value == 1) {
    local_c = 2;
  }
  else if (Value == 2) {
    local_c = 1;
  }
  else {
    if (Value != 3) {
      __assert_fail("Value == AU_VALX",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieNew.c"
                    ,0x4f2,"int Au_XsimInv(int)");
    }
    local_c = 3;
  }
  return local_c;
}

Assistant:

static inline int  Au_XsimInv( int Value )   
{ 
    if ( Value == AU_VAL0 )
        return AU_VAL1;
    if ( Value == AU_VAL1 )
        return AU_VAL0;
    assert( Value == AU_VALX );       
    return AU_VALX;
}